

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workitem.cpp
# Opt level: O1

void __thiscall
depspawn::internal::Workitem::insert_in_worklist(Workitem *this,AbstractRunner *itask)

{
  _dep **pp_Var1;
  __atomic_flag_data_type _Var2;
  ulong uVar3;
  Task *task_ptr;
  long lVar4;
  Workitem *pWVar5;
  Workitem *pWVar6;
  _dep *p_Var7;
  long *plVar8;
  _dep **pp_Var9;
  _dep **pp_Var10;
  long lVar11;
  Workitem *pWVar12;
  int iVar13;
  arg_info *paVar14;
  ulong uVar15;
  arg_info *this_00;
  long *plVar16;
  bool bVar17;
  long alStack_80 [2];
  _dep **local_70;
  long *local_68;
  Workitem *local_60;
  ulong local_58;
  Workitem *local_50;
  ulong local_48;
  arg_info *local_40;
  int local_34;
  
  local_48 = (ulong)(uint)(int)this->nargs_;
  lVar4 = -((ulong)((int)this->nargs_ + 1) * 8 + 0xf & 0xfffffffffffffff0);
  plVar16 = (long *)((long)alStack_80 + lVar4 + 8);
  plVar8 = plVar16;
  for (paVar14 = this->args; paVar14 != (arg_info *)0x0; paVar14 = paVar14->next) {
    *plVar8 = (long)paVar14;
    plVar8 = plVar8 + 1;
  }
  plVar16[(int)local_48] = 0;
  this->task = itask;
  pWVar12 = this->father;
  pWVar6 = (anonymous_namespace)::worklist;
  do {
    this->next = pWVar6;
    LOCK();
    bVar17 = pWVar6 != (anonymous_namespace)::worklist;
    pWVar5 = this;
    if (bVar17) {
      pWVar6 = (anonymous_namespace)::worklist;
      pWVar5 = (anonymous_namespace)::worklist;
    }
    (anonymous_namespace)::worklist = pWVar5;
    UNLOCK();
  } while (bVar17);
  pWVar6 = this->next;
  if (pWVar6 == (Workitem *)0x0) {
    local_34 = 0;
    uVar15 = 0;
  }
  else {
    uVar15 = 0;
    local_34 = 0;
    local_50 = this;
    local_68 = plVar16;
    do {
      if (pWVar6 != this) {
        if (pWVar6 == pWVar12) {
          pWVar12 = pWVar6->father;
          if (pWVar12 == (Workitem *)0x0) {
            pWVar12 = (Workitem *)0x0;
          }
          else {
            *(undefined8 *)((long)alStack_80 + lVar4) = 0x10a8cb;
            bVar17 = is_contained(this,pWVar12);
            if (bVar17) {
              *(byte *)&this->optFlags_ = (byte)this->optFlags_ | 2;
              break;
            }
          }
        }
        else if ((short)pWVar6->status < 4) {
          local_58 = uVar15;
          local_60 = pWVar12;
          paVar14 = pWVar6->args;
          this_00 = (arg_info *)*plVar16;
          local_70 = &pWVar6->deps;
          pp_Var1 = &pWVar6->lastdep;
          iVar13 = 0;
          do {
            if ((paVar14 == (arg_info *)0x0) || (this_00 == (arg_info *)0x0)) break;
            if (this_00->rank == '\0') {
              if ((paVar14->wr != false) || (this_00->wr == true)) {
                uVar15 = paVar14->addr;
                uVar3 = this_00->addr;
                bVar17 = uVar3 <= (uVar15 + paVar14->size) - 1;
                if (uVar3 < uVar15) {
                  bVar17 = uVar15 <= (uVar3 + this_00->size) - 1;
                }
                goto LAB_0010a7b5;
              }
LAB_0010a838:
              if (paVar14->addr < this_00->addr) {
                paVar14 = paVar14->next;
              }
              else {
                lVar11 = (long)iVar13;
                iVar13 = iVar13 + 1;
                this_00 = (arg_info *)plVar16[lVar11 + 1];
              }
              bVar17 = true;
            }
            else {
              if (paVar14->addr != this_00->addr) goto LAB_0010a838;
              local_40 = this_00;
              *(undefined8 *)((long)alStack_80 + lVar4) = 0x10a75b;
              bVar17 = arg_info::overlap_array(this_00,paVar14);
              this_00 = local_40;
LAB_0010a7b5:
              pWVar12 = local_50;
              if (bVar17 == false) goto LAB_0010a838;
              local_40 = (arg_info *)CONCAT44(local_40._4_4_,iVar13);
              LOCK();
              (local_50->ndependencies).super___atomic_base<int>._M_i =
                   (local_50->ndependencies).super___atomic_base<int>._M_i + 1;
              UNLOCK();
              *(undefined8 *)((long)alStack_80 + lVar4) = 0x10a7d4;
              p_Var7 = LinkedListPool<depspawn::internal::Workitem::_dep,_true,_false>::intl_malloc
                                 ((LinkedListPool<depspawn::internal::Workitem::_dep,_true,_false> *
                                  )_dep::Pool);
              plVar16 = local_68;
              p_Var7->next = (_dep *)0x0;
              p_Var7->w = pWVar12;
              do {
                LOCK();
                _Var2 = (pWVar6->deps_mutex_).super___atomic_flag_base._M_i;
                (pWVar6->deps_mutex_).super___atomic_flag_base._M_i = true;
                UNLOCK();
              } while (_Var2 != false);
              pp_Var9 = pp_Var1;
              pp_Var10 = local_70;
              if (*local_70 != (_dep *)0x0) {
                pp_Var9 = &(*pp_Var1)->next;
                pp_Var10 = pp_Var1;
              }
              *pp_Var9 = p_Var7;
              *pp_Var10 = p_Var7;
              (pWVar6->deps_mutex_).super___atomic_flag_base._M_i = false;
              iVar13 = (int)local_40;
              if (paVar14->wr == true) {
                if (this_00->rank == '\0') {
                  bVar17 = false;
                  if (this_00->addr < paVar14->addr) goto LAB_0010a862;
                  if (this_00->addr + this_00->size <= paVar14->addr + paVar14->size)
                  goto LAB_0010a889;
                }
                else {
                  *(undefined8 *)((long)alStack_80 + lVar4) = 0x10a82c;
                  bVar17 = arg_info::is_contained_array(this_00,paVar14);
                  if (bVar17) {
LAB_0010a889:
                    iVar13 = (int)local_48;
                    if ((int)local_40 < iVar13) {
                      lVar11 = (long)(int)local_40;
                      do {
                        plVar16[lVar11] = plVar16[lVar11 + 1];
                        lVar11 = lVar11 + 1;
                      } while (iVar13 != lVar11);
                    }
                    bVar17 = false;
                    local_48 = (ulong)(iVar13 - 1);
                    iVar13 = (int)local_40;
                  }
                  else {
                    bVar17 = false;
                    iVar13 = (int)local_40;
                  }
                }
              }
              else {
LAB_0010a862:
                bVar17 = false;
              }
            }
          } while (bVar17);
          uVar15 = (ulong)((int)local_58 + (uint)((short)pWVar6->status < 2));
          local_34 = local_34 + (uint)(pWVar6->status == Ready);
          pWVar12 = local_60;
          this = local_50;
          if (pWVar6->status == Filling) {
            *(byte *)&local_50->optFlags_ = (byte)local_50->optFlags_ | 1;
          }
        }
      }
      pWVar6 = pWVar6->next;
    } while (pWVar6 != (Workitem *)0x0);
  }
  if (local_34 <= FAST_THRESHOLD) {
    bVar17 = false;
    if ((local_34 <= Nthreads) || (bVar17 = false, (int)uVar15 <= FAST_THRESHOLD))
    goto LAB_0010a948;
  }
  bVar17 = true;
LAB_0010a948:
  if ((this->ndependencies).super___atomic_base<int>._M_i == 0) {
    this->status = Ready;
    task_ptr = this->task;
    *(undefined8 *)((long)alStack_80 + lVar4) = 0x10a974;
    TaskPool::enqueue(TP,task_ptr);
  }
  else {
    this->status = Waiting;
  }
  if (bVar17) {
    TaskPool::try_run(TP);
    return;
  }
  return;
}

Assistant:

void Workitem::insert_in_worklist(AbstractRunner* itask)
    { Workitem* p;
      arg_info *arg_p, *arg_w;

      //Save original list of arguments
      int nargs = static_cast<int>(nargs_);
      arg_info* argv[nargs+1];
      arg_w = args;
      for (int i = 0; arg_w != nullptr; i++) {
        argv[i] = arg_w;     //printf("Fill %d %lu\n", i, arg_w->addr);
        arg_w = arg_w->next;
      }
      argv[nargs] = nullptr;
      
      DEPSPAWN_PROFILEDEFINITION(unsigned int profile_workitems_in_list_lcl = 0,
                                              profile_workitems_in_list_active_lcl = 0);
      DEPSPAWN_PROFILEDEFINITION(bool profile_early_termination_lcl = false);
      
      DEPSPAWN_PROFILEACTION(profile_jobs++);
      
#ifdef DEPSPAWN_FAST_START
#ifdef DEPSPAWN_USE_TBB
      AbstractBoxedFunction *stolen_abf = nullptr;
      static constexpr int FAST_ARR_SZ  = 16;
      Workitem* fast_arr[FAST_ARR_SZ];
#else
      bool steal_work = false;
#endif
      int nready = 0, nfillwait = 0;
#endif
      
      task = itask;
      
      Workitem* ancestor = father;

      next = worklist.load(std::memory_order_relaxed);
      while(!worklist.compare_exchange_weak(next, this));

      for(p = next; p != nullptr; p = p->next) {

        DEPSPAWN_PROFILEACTION(profile_workitems_in_list_lcl++);
        
        // sometimes p == this, even if it shouldn't
        if(p == this) { // fprintf(stderr, "myself?\n");
          continue; // FIXIT
        }
        if(p == ancestor) {
          ancestor = p->father;
          /// TODO: is_contained should be adapted to use argv
          if ( (ancestor != nullptr) && is_contained(this, ancestor)) {
            DEPSPAWN_PROFILEACTION(profile_early_termination_lcl = true);
            optFlags_ |= OptFlags::FatherScape;
            break;
          }
        } else {
          const auto tmp_status = p->status;
          if(tmp_status < Status_t::Done) {
            DEPSPAWN_PROFILEACTION(profile_workitems_in_list_active_lcl++);
            int arg_w_i = 0;
            arg_p = p->args; // preexisting workitem
            arg_w = argv[0]; // New workitem
            while(arg_p && arg_w) {

              const bool conflict = arg_w->is_array()
              ? ( (arg_p->addr == arg_w->addr) && arg_w->overlap_array(arg_p) )
              : ( (arg_p->wr || arg_w->wr) && overlaps(arg_p, arg_w) );
              
              if(conflict) { // Found a dependency
                ndependencies++;
                Workitem::_dep* newdep = Workitem::_dep::Pool.malloc();
                newdep->next = nullptr;
                newdep->w = this;
                
                while (p->deps_mutex_.test_and_set(std::memory_order_acquire))  // acquire lock
                  ; // spin
                
                if(!p->deps)
                  p->deps = p->lastdep = newdep;
                else {
                  p->lastdep->next = newdep;
                  p->lastdep = p->lastdep->next;
                }

                //lock.release();
                p->deps_mutex_.clear(std::memory_order_release);               // release lock
                
                DEPSPAWN_DEBUGACTION(
                                     /* You can be linking to Done's that are waiting for you to Fill-in
                                       but NOT for Deallocatable Workitems */
                                     if(p->status == Status_t::Deallocatable) {
                                       printf("%p -> Deallocatable %p (was %d)", this, p, (int)tmp_status);
                                       assert(false);
                                     }
                                     ); // END DEPSPAWN_DEBUGACTION
                if (arg_p->wr &&
                    (arg_w->is_array() ? arg_w->is_contained_array(arg_p) : contains(arg_p, arg_w))) {
                  nargs--;
                  /*
                  if (!nargs) {
                    DEPSPAWN_PROFILEACTION(profile_early_termination_lcl = true); //not true actually...
                    // The optimal thing would be to just make this goto to leave the main loop and insert
                    // the Workitem waiting. But in tests with repeated spawns this leads to very fast insertion
                    // that slows down the performance. Other advantages of continuing down the list:
                    // - More likely DEPSPAWN_FAST_START is triggered and it uses oldest tasks
                    // - optFlags_ is correctly computed
      
                    //goto OUT_MAIN_insert_in_worklist_LOOP;
      
                      argv[0] = nullptr;
                    //break; //There is another break anyway there down
                  } else {
                   */
                    for (int i = arg_w_i; i <= nargs; i++) {
                      argv[i] = argv[i+1];
                    }
                  /*}*/
                }
                break;
              } else {
                if(arg_p->addr < arg_w->addr) {
                  arg_p = arg_p->next;
                } else {
                  arg_w = argv[++arg_w_i];
                }
              }
            }
            
#ifdef DEPSPAWN_FAST_START
            const auto tmp_status = p->status;
            nfillwait += ( tmp_status < Status_t::Ready );
            if ( tmp_status == Status_t::Ready ) {
#ifdef DEPSPAWN_USE_TBB
              fast_arr[nready & (FAST_ARR_SZ - 1)] = p;
#endif
              nready++;
            }
#endif
            if( p->status == Status_t::Filling ) {
              optFlags_ |=  OptFlags::PendingFills;
            }
          }
        }
      }
      
//OUT_MAIN_insert_in_worklist_LOOP:
      
#ifdef DEPSPAWN_FAST_START
      if ((nready > FAST_THRESHOLD) || ((nready > Nthreads) && (nfillwait > FAST_THRESHOLD))) {
        DEPSPAWN_PROFILEACTION(profile_steal_attempts++);
#ifdef DEPSPAWN_USE_TBB
        nready = (nready - 1) & (FAST_ARR_SZ - 1);
        do {
          p = fast_arr[nready--];
          stolen_abf = p->steal();
        } while ( (stolen_abf == nullptr) && (nready >= 0) );
#else
        steal_work = true;
#endif
      }
#endif

      // This is set after stealing work because this way
      // the fast_arr workitems should not have been deallocated
      //status = (!ndependencies) ? Ready : Waiting;
      if (!ndependencies) {
        post();
      } else {
        status = Status_t::Waiting;
      }

#ifdef DEPSPAWN_FAST_START
#ifdef DEPSPAWN_USE_TBB
      if (stolen_abf != nullptr) {
        DEPSPAWN_PROFILEACTION(profile_steals++);
        stolen_abf->run_in_env(false);
        delete stolen_abf;
      }
#else
      if(steal_work && TP->try_run()) {
        DEPSPAWN_PROFILEACTION(profile_steals++);
      }
#endif
#endif
      
      DEPSPAWN_PROFILEACTION(
                             if(profile_early_termination_lcl) {
                               profile_early_terminations++;
                               profile_workitems_in_list_early_termination += profile_workitems_in_list_lcl;
                               profile_workitems_in_list_active_early_termination += profile_workitems_in_list_active_lcl;
                             }
                             profile_workitems_in_list += profile_workitems_in_list_lcl;
                             profile_workitems_in_list_active += profile_workitems_in_list_active_lcl;
                             );
    }